

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall dxil_spv::CFGStructurizer::insert_phi(CFGStructurizer *this)

{
  CFGNode *pCVar1;
  bool bVar2;
  size_type sVar3;
  reference ppCVar4;
  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *this_00;
  reference ppCVar5;
  Vector<Operation_*> *this_01;
  reference ppOVar6;
  mapped_type *ppCVar7;
  iterator iVar8;
  iterator iVar9;
  reference node_00;
  PHINode *phi_node;
  iterator __end1_2;
  iterator __begin1_2;
  Vector<PHINode> *__range1_2;
  Operation *op;
  iterator __end2_1;
  iterator __begin2_1;
  Vector<Operation_*> *__range2_1;
  uint local_c0;
  reference local_b8;
  PHI *phi;
  iterator __end2;
  iterator __begin2;
  Vector<PHI> *__range2;
  uint phi_index;
  CFGNode *node_1;
  iterator __end1_1;
  iterator __begin1_1;
  Vector<CFGNode_*> *__range1_1;
  const_iterator local_68;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_60;
  CFGNode **local_58;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_50;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  local_48;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  itr;
  CFGNode *succ;
  CFGNode *back_edge;
  CFGNode *node;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGStructurizer *this_local;
  
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(&this->forward_post_visit_order);
  node = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   (&this->forward_post_visit_order);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                *)&node);
    if (!bVar2) {
      prune_dead_preds(this);
      fixup_broken_value_dominance(this);
      __end1_1 = std::
                 vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                 begin(&this->forward_post_visit_order);
      node_1 = (CFGNode *)
               std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               end(&this->forward_post_visit_order);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                            *)&node_1);
        if (!bVar2) break;
        ppCVar5 = __gnu_cxx::
                  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                  ::operator*(&__end1_1);
        pCVar1 = *ppCVar5;
        __range2._4_4_ = 0;
        __end2 = std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::begin
                           (&(pCVar1->ir).phi);
        phi = (PHI *)std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::end
                               (&(pCVar1->ir).phi);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
                                      *)&phi);
          if (!bVar2) break;
          local_b8 = __gnu_cxx::
                     __normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
                     ::operator*(&__end2);
          local_c0 = __range2._4_4_;
          __range2_1 = (Vector<Operation_*> *)pCVar1;
          std::
          vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
          ::push_back(&this->phi_nodes,(value_type *)&__range2_1);
          if (local_b8->id != 0) {
            ppCVar7 = std::
                      unordered_map<unsigned_int,_dxil_spv::CFGNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>_>
                      ::operator[](&this->value_id_to_block,&local_b8->id);
            *ppCVar7 = pCVar1;
          }
          __range2._4_4_ = __range2._4_4_ + 1;
          __gnu_cxx::
          __normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
          ::operator++(&__end2);
        }
        this_01 = &(pCVar1->ir).operations;
        __end2_1 = std::
                   vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                   ::begin(this_01);
        op = (Operation *)
             std::
             vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
             end(this_01);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end2_1,
                             (__normal_iterator<dxil_spv::Operation_**,_std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>_>
                              *)&op);
          if (!bVar2) break;
          ppOVar6 = __gnu_cxx::
                    __normal_iterator<dxil_spv::Operation_**,_std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>_>
                    ::operator*(&__end2_1);
          if ((*ppOVar6)->id != 0) {
            ppCVar7 = std::
                      unordered_map<unsigned_int,_dxil_spv::CFGNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>_>
                      ::operator[](&this->value_id_to_block,&(*ppOVar6)->id);
            *ppCVar7 = pCVar1;
          }
          __gnu_cxx::
          __normal_iterator<dxil_spv::Operation_**,_std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>_>
          ::operator++(&__end2_1);
        }
        __gnu_cxx::
        __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
        ::operator++(&__end1_1);
      }
      iVar8 = std::
              vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
              ::begin(&this->phi_nodes);
      iVar9 = std::
              vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
              ::end(&this->phi_nodes);
      std::
      sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,dxil_spv::CFGStructurizer::insert_phi()::__0>
                (iVar8._M_current,iVar9._M_current);
      __end1_2 = std::
                 vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                 ::begin(&this->phi_nodes);
      phi_node = (PHINode *)
                 std::
                 vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                 ::end(&this->phi_nodes);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end1_2,
                           (__normal_iterator<dxil_spv::CFGStructurizer::PHINode_*,_std::vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>_>
                            *)&phi_node);
        if (!bVar2) break;
        node_00 = __gnu_cxx::
                  __normal_iterator<dxil_spv::CFGStructurizer::PHINode_*,_std::vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>_>
                  ::operator*(&__end1_2);
        fixup_phi(this,node_00);
        insert_phi(this,node_00);
        __gnu_cxx::
        __normal_iterator<dxil_spv::CFGStructurizer::PHINode_*,_std::vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>_>
        ::operator++(&__end1_2);
      }
      return;
    }
    ppCVar5 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    back_edge = *ppCVar5;
    if (((back_edge->pred_back_edge != (CFGNode *)0x0) &&
        ((back_edge->pred_back_edge->ir).terminator.type == Branch)) &&
       (back_edge->pred_back_edge->succ_back_edge ==
        (back_edge->pred_back_edge->ir).terminator.direct_block)) {
      sVar3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::size(&back_edge->pred_back_edge->succ);
      if (sVar3 == 1) {
        succ = back_edge->pred_back_edge;
        ppCVar4 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::front(&succ->succ);
        itr._M_current = (CFGNode **)*ppCVar4;
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        clear(&succ->succ);
        local_50._M_current =
             (CFGNode **)
             std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      *)(itr._M_current + 0x28));
        local_58 = (CFGNode **)
                   std::
                   vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ::end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          *)(itr._M_current + 0x28));
        local_48 = std::
                   find<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,dxil_spv::CFGNode*>
                             (local_50,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                        )local_58,&succ);
        local_60._M_current =
             (CFGNode **)
             std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    *)(itr._M_current + 0x28));
        bVar2 = __gnu_cxx::operator!=(&local_48,&local_60);
        if (!bVar2) {
          __assert_fail("itr != succ->pred.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                        ,0x807,"void dxil_spv::CFGStructurizer::insert_phi()");
        }
        this_00 = (vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   *)(itr._M_current + 0x28);
        __gnu_cxx::
        __normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>
        ::__normal_iterator<dxil_spv::CFGNode**>
                  ((__normal_iterator<dxil_spv::CFGNode*const*,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>
                    *)&local_68,&local_48);
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        erase(this_00,local_68);
        CFGNode::recompute_immediate_dominator((CFGNode *)itr._M_current);
      }
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void CFGStructurizer::insert_phi()
{
	// If we inserted dummy branches from back-edge to rewrite infinite loops, we must prune these branches
	// now, so we don't end up creating a wrong amount of PHI incoming values.
	// We don't have to recompute the CFG since we don't really care about post-visit orders at this stage.
	for (auto *node : forward_post_visit_order)
	{
		if (node->pred_back_edge && node->pred_back_edge->ir.terminator.type == Terminator::Type::Branch &&
		    node->pred_back_edge->succ_back_edge == node->pred_back_edge->ir.terminator.direct_block &&
		    node->pred_back_edge->succ.size() == 1)
		{
			auto *back_edge = node->pred_back_edge;
			auto *succ = back_edge->succ.front();
			back_edge->succ.clear();
			auto itr = std::find(succ->pred.begin(), succ->pred.end(), back_edge);
			assert(itr != succ->pred.end());
			succ->pred.erase(itr);
			succ->recompute_immediate_dominator();
		}
	}

	prune_dead_preds();

	// It is possible that an SSA value was created in a block, and consumed in another.
	// With CFG rewriting branches, it is possible that dominance relationship no longer holds
	// and we must insert new dummy IDs to resolve this.
	fixup_broken_value_dominance();

	// Build a map of value ID -> creating block.
	// This allows us to detect if a value is consumed in a situation where the declaration does not dominate use.
	// This can happen when introducing ladder blocks or similar.
	for (auto *node : forward_post_visit_order)
	{
		unsigned phi_index = 0;
		for (auto &phi : node->ir.phi)
		{
			phi_nodes.push_back({ node, phi_index });
			if (phi.id)
				value_id_to_block[phi.id] = node;
			phi_index++;
		}

		for (auto *op : node->ir.operations)
			if (op->id)
				value_id_to_block[op->id] = node;
	}

	// Resolve phi-nodes top-down since PHI nodes may depend on other PHI nodes.
	std::sort(phi_nodes.begin(), phi_nodes.end(),
	          [](const PHINode &a, const PHINode &b) { return a.block->forward_post_visit_order > b.block->forward_post_visit_order; });

	for (auto &phi_node : phi_nodes)
	{
		fixup_phi(phi_node);
		insert_phi(phi_node);
	}
}